

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O3

void __thiscall assembler::SessionPDU::skipLines(SessionPDU *this,int skip)

{
  pointer puVar1;
  ulong in_RAX;
  difference_type __offset;
  ulong uVar2;
  size_type __n;
  undefined8 uStack_28;
  
  __n = (size_type)
        ((this->szParam_)._M_t.super___uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>.
         _M_t.super__Tuple_impl<0UL,_SZ_com_t_s_*,_std::default_delete<SZ_com_t_s>_>.
         super__Head_base<0UL,_SZ_com_t_s_*,_false>._M_head_impl)->pixels_per_scanline;
  puVar1 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  uStack_28 = in_RAX;
  if (uVar2 == (this->ph_).totalHeaderLength) {
    uStack_28 = in_RAX & 0xffffffffffffff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
              (&this->buf_,(iterator)(puVar1 + uVar2),__n,
               (value_type_conflict2 *)((long)&uStack_28 + 7));
    this->linesDone_ = this->linesDone_ + 1;
    skip = skip + -1;
  }
  if (0 < skip) {
    do {
      puVar1 = (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buf_,puVar1,
                 (long)puVar1 - __n);
      this->linesDone_ = this->linesDone_ + 1;
      skip = skip + -1;
    } while (skip != 0);
  }
  return;
}

Assistant:

void SessionPDU::skipLines(int skip) {
  auto columns = szParam_->pixels_per_scanline;

  // The header must be complete or this function would not be called,
  // so the number of bytes in excess of the header must be greater
  // than or equal to 0.
  auto bytes = buf_.size() - ph_.totalHeaderLength;
  ASSERT(bytes >= 0);

  // Insert black line if there is no contents yet
  if (bytes == 0) {
    buf_.insert(buf_.end(), columns, 0);
    linesDone_++;
    skip--;
  }

  // Insert copies of the most recent line
  for (auto i = 0; i < skip; i++) {
    buf_.insert(buf_.end(), buf_.end() - columns, buf_.end());
    linesDone_++;
  }
}